

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

void __thiscall ws::Record::add<int&>(Record *this,int *data)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = *data;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00159f25;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00159f25;
      }
      if (uVar3 < 10000) goto LAB_00159f25;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00159f25:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(-((int)uVar1 >> 0x1f) + __len),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&this->message,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(T &&data)
    {
      using DataType = std::remove_cvref_t<T>;
      if constexpr (std::is_same_v<char, DataType>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<DataType, std::string>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<std::decay_t<DataType>, const char *>
                         || std::is_same_v<std::decay_t<DataType>, char *>
          )
      {
        message += data;
      }
      else
      {
        message += std::to_string(data);
      }
    }